

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256Bytes_Test::~HashUtil_Sha256Bytes_Test(HashUtil_Sha256Bytes_Test *this)

{
  HashUtil_Sha256Bytes_Test *this_local;
  
  ~HashUtil_Sha256Bytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha256Bytes) {
  std::vector<uint8_t> target;
  target.push_back(0x01);
  target.push_back(0x02);
  target.push_back(0x03);
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "039058c6f2c0cb492c533b0a4d14ef77cc0f78abccced5287d84a1a2011cfb81");
}